

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *other;
  OneofDescriptor *pOVar3;
  FieldDescriptor *field_00;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Formatter format;
  LogMessage local_60;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  string *prefix_local;
  Printer *printer_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)prefix;
  prefix_local = (string *)printer;
  bVar1 = HasHasbit(field);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0xdd);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !HasHasbit(field): ");
    internal::LogFinisher::operator=
              ((LogFinisher *)
               ((long)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  Formatter::Formatter((Formatter *)local_b0,(Printer *)prefix_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"prefix",&local_d1);
  Formatter::Set<std::__cxx11::string>
            ((Formatter *)local_b0,&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_local);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"name",&local_f9);
  FieldName_abi_cxx11_(&local_120,(cpp *)local_28,field_00);
  Formatter::Set<std::__cxx11::string>((Formatter *)local_b0,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = FieldDescriptor::is_repeated(local_28);
  if ((bVar1) ||
     (pOVar3 = FieldDescriptor::containing_oneof(local_28), pOVar3 != (OneofDescriptor *)0x0)) {
    pOVar3 = FieldDescriptor::real_containing_oneof(local_28);
    if (pOVar3 == (OneofDescriptor *)0x0) {
      printer_local._7_1_ = 0;
    }
    else {
      Formatter::operator()<>((Formatter *)local_b0,"if (_internal_has_$name$()) {\n");
      Formatter::Indent((Formatter *)local_b0);
      printer_local._7_1_ = 1;
    }
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_28);
    if (CVar2 == CPPTYPE_STRING) {
      Formatter::operator()<>((Formatter *)local_b0,"if (!$prefix$_internal_$name$().empty()) {\n");
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(local_28);
      if (CVar2 == CPPTYPE_MESSAGE) {
        Formatter::operator()<>((Formatter *)local_b0,"if ($prefix$_internal_has_$name$()) {\n");
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(local_28);
        if (CVar2 == CPPTYPE_FLOAT) {
          Formatter::operator()<>
                    ((Formatter *)local_b0,
                     "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes uint32_t and float are the same size.\");\nfloat tmp_$name$ = $prefix$_internal_$name$();\nuint32_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
                    );
        }
        else {
          CVar2 = FieldDescriptor::cpp_type(local_28);
          if (CVar2 == CPPTYPE_DOUBLE) {
            Formatter::operator()<>
                      ((Formatter *)local_b0,
                       "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes uint64_t and double are the same size.\");\ndouble tmp_$name$ = $prefix$_internal_$name$();\nuint64_t raw_$name$;\nmemcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\nif (raw_$name$ != 0) {\n"
                      );
          }
          else {
            Formatter::operator()<>
                      ((Formatter *)local_b0,"if ($prefix$_internal_$name$() != 0) {\n");
          }
        }
      }
    }
    Formatter::Indent((Formatter *)local_b0);
    printer_local._7_1_ = 1;
  }
  Formatter::~Formatter((Formatter *)local_b0);
  return (bool)(printer_local._7_1_ & 1);
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const std::string& prefix,
                                  const FieldDescriptor* field) {
  GOOGLE_CHECK(!HasHasbit(field));
  Formatter format(printer);
  format.Set("prefix", prefix);
  format.Set("name", FieldName(field));
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      format("if (!$prefix$_internal_$name$().empty()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      format("if ($prefix$_internal_has_$name$()) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT) {
      format(
          "static_assert(sizeof(uint32_t) == sizeof(float), \"Code assumes "
          "uint32_t and float are the same size.\");\n"
          "float tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint32_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE) {
      format(
          "static_assert(sizeof(uint64_t) == sizeof(double), \"Code assumes "
          "uint64_t and double are the same size.\");\n"
          "double tmp_$name$ = $prefix$_internal_$name$();\n"
          "uint64_t raw_$name$;\n"
          "memcpy(&raw_$name$, &tmp_$name$, sizeof(tmp_$name$));\n"
          "if (raw_$name$ != 0) {\n");
    } else {
      format("if ($prefix$_internal_$name$() != 0) {\n");
    }
    format.Indent();
    return true;
  } else if (field->real_containing_oneof()) {
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    return true;
  }
  return false;
}